

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synthetic.h
# Opt level: O0

vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_> *
FastPForLib::generateArray(uint32_t N,uint32_t mask)

{
  uint uVar1;
  allocator_type *__a;
  reference pvVar2;
  uint in_EDX;
  uint in_ESI;
  vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_> *in_RDI;
  size_t k;
  vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_> *ans;
  AlignedSTLAllocator<unsigned_int,_64UL> *this;
  vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>
  *in_stack_ffffffffffffffd0;
  ulong __n;
  AlignedSTLAllocator<unsigned_int,_64UL> local_12;
  undefined1 local_11;
  uint local_10;
  uint local_c;
  
  local_11 = 0;
  __a = (allocator_type *)(ulong)in_ESI;
  this = &local_12;
  local_10 = in_EDX;
  local_c = in_ESI;
  AlignedSTLAllocator<unsigned_int,_64UL>::AlignedSTLAllocator(this);
  std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>::vector
            (in_stack_ffffffffffffffd0,(size_type)this,__a);
  AlignedSTLAllocator<unsigned_int,_64UL>::~AlignedSTLAllocator(&local_12);
  for (__n = 0; __n < local_c; __n = __n + 1) {
    uVar1 = rand();
    uVar1 = uVar1 & local_10;
    pvVar2 = std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>::
             operator[](in_RDI,__n);
    *pvVar2 = uVar1;
  }
  return in_RDI;
}

Assistant:

std::vector<uint32_t, cacheallocator>
generateArray(uint32_t N, const uint32_t mask = 0xFFFFFFFFU) {
  std::vector<uint32_t, cacheallocator> ans(N);
  for (size_t k = 0; k < N; ++k)
    ans[k] = rand() & mask;
  return ans;
}